

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall
QComboBox::insertItem(QComboBox *this,int index,QIcon *icon,QString *text,QVariant *userData)

{
  QPersistentModelIndex *this_00;
  int iVar1;
  QComboBoxPrivate *this_01;
  QAbstractItemModel *pQVar2;
  char cVar3;
  int iVar4;
  QStandardItemModel *this_02;
  QStandardItem *this_03;
  int iVar5;
  long in_FS_OFFSET;
  int local_84;
  QMap<int,_QVariant> local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
  iVar4 = count(this);
  if (iVar4 < index) {
    index = iVar4;
  }
  iVar5 = 0;
  if (0 < index) {
    iVar5 = index;
  }
  if (this_01->maxCount <= iVar5) goto LAB_003b3193;
  this_02 = QtPrivate::qobject_cast_helper<QStandardItemModel*,QObject>((QObject *)this_01->model);
  if (this_02 == (QStandardItemModel *)0x0) {
    this_01->field_0x34c = this_01->field_0x34c | 8;
    pQVar2 = this_01->model;
    this_00 = &this_01->root;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
    cVar3 = (**(code **)(*(long *)pQVar2 + 0xf8))(pQVar2,iVar5,1,&local_58);
    if (cVar3 != '\0') {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar2 = this_01->model;
      iVar1 = this_01->modelColumn;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
      (**(code **)(*(long *)pQVar2 + 0x60))(&local_78,pQVar2,iVar5,iVar1,&local_58);
      cVar3 = QIcon::isNull();
      if ((cVar3 == '\0') || (3 < *(ulong *)&(userData->d).field_0x18)) {
        local_80.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              )(totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
                )0x0;
        if ((text->d).ptr != (char16_t *)0x0) {
          local_84 = 2;
          ::QVariant::QVariant((QVariant *)&local_58,(QString *)text);
          QMap<int,_QVariant>::insert(&local_80,&local_84,(QVariant *)&local_58);
          ::QVariant::~QVariant((QVariant *)&local_58);
        }
        cVar3 = QIcon::isNull();
        if (cVar3 == '\0') {
          local_84 = 1;
          QIcon::operator_cast_to_QVariant((QVariant *)&local_58,icon);
          QMap<int,_QVariant>::insert(&local_80,&local_84,(QVariant *)&local_58);
          ::QVariant::~QVariant((QVariant *)&local_58);
        }
        if (3 < *(ulong *)&(userData->d).field_0x18) {
          local_58._0_4_ = 0x100;
          QMap<int,_QVariant>::insert(&local_80,(int *)local_58.data,userData);
        }
        if ((local_80.d.d.ptr !=
             (totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
              )0x0) && (*(size_t *)((long)local_80.d.d.ptr + 0x30) != 0)) {
          (**(code **)(*(long *)this_01->model + 0xb8))(this_01->model,&local_78,&local_80);
        }
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&local_80.d);
      }
      else {
        pQVar2 = this_01->model;
        ::QVariant::QVariant((QVariant *)&local_58,(QString *)text);
        (**(code **)(*(long *)pQVar2 + 0x98))(pQVar2,&local_78,&local_58,2);
        ::QVariant::~QVariant((QVariant *)&local_58);
      }
      this_01->field_0x34c = this_01->field_0x34c & 0xf7;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
      QComboBoxPrivate::rowsInserted(this_01,(QModelIndex *)&local_58,iVar5,iVar5);
      goto LAB_003b3153;
    }
    this_01->field_0x34c = this_01->field_0x34c & 0xf7;
  }
  else {
    this_03 = (QStandardItem *)operator_new(0x10);
    QStandardItem::QStandardItem(this_03,(QString *)text);
    cVar3 = QIcon::isNull();
    if (cVar3 == '\0') {
      QIcon::operator_cast_to_QVariant((QVariant *)&local_58,icon);
      (**(code **)(*(long *)this_03 + 0x20))(this_03,&local_58,1);
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    if (3 < *(ulong *)&(userData->d).field_0x18) {
      (**(code **)(*(long *)this_03 + 0x20))(this_03,userData,0x100);
    }
    QStandardItemModel::insertRow(this_02,iVar5,this_03);
LAB_003b3153:
    iVar4 = iVar4 + 1;
  }
  iVar5 = iVar4 - this_01->maxCount;
  if (iVar5 != 0 && this_01->maxCount <= iVar4) {
    pQVar2 = this_01->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,&this_01->root);
    (**(code **)(*(long *)pQVar2 + 0x108))(pQVar2,iVar4 + -1,iVar5,&local_58);
  }
LAB_003b3193:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::insertItem(int index, const QIcon &icon, const QString &text, const QVariant &userData)
{
    Q_D(QComboBox);
    int itemCount = count();
    index = qBound(0, index, itemCount);
    if (index >= d->maxCount)
        return;

    // For the common case where we are using the built in QStandardItemModel
    // construct a QStandardItem, reducing the number of expensive signals from the model
    if (QStandardItemModel *m = qobject_cast<QStandardItemModel*>(d->model)) {
        QStandardItem *item = new QStandardItem(text);
        if (!icon.isNull()) item->setData(icon, Qt::DecorationRole);
        if (userData.isValid()) item->setData(userData, Qt::UserRole);
        m->insertRow(index, item);
        ++itemCount;
    } else {
        d->inserting = true;
        if (d->model->insertRows(index, 1, d->root)) {
            QModelIndex item = d->model->index(index, d->modelColumn, d->root);
            if (icon.isNull() && !userData.isValid()) {
                d->model->setData(item, text, Qt::EditRole);
            } else {
                QMap<int, QVariant> values;
                if (!text.isNull()) values.insert(Qt::EditRole, text);
                if (!icon.isNull()) values.insert(Qt::DecorationRole, icon);
                if (userData.isValid()) values.insert(Qt::UserRole, userData);
                if (!values.isEmpty()) d->model->setItemData(item, values);
            }
            d->inserting = false;
            d->rowsInserted(d->root, index, index);
            ++itemCount;
        } else {
            d->inserting = false;
        }
    }

    if (itemCount > d->maxCount)
        d->model->removeRows(itemCount - 1, itemCount - d->maxCount, d->root);
}